

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_vector.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
utility::random_vector<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,size_t size,int min,int max)

{
  pointer __first;
  anon_class_16_2_a39a3d48 __gen;
  uniform_int_distribution<int> uniform;
  default_random_engine generator;
  uniform_int_distribution<int> local_30;
  default_random_engine local_28;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,size,(allocator_type *)&local_30);
  local_28._M_x = 1;
  __first = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  __gen.generator = &local_28;
  __gen.uniform = &local_30;
  local_30._M_param._M_a = min;
  local_30._M_param._M_b = max;
  std::
  generate_n<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,unsigned_long,utility::random_vector<int>(unsigned_long,int,int)::_lambda()_1_>
            ((uchar *)__first,
             (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)__first >> 2,__gen);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integer> random_vector (std::size_t size, Integer min, Integer max)
    {
        std::vector<Integer> numbers(size);

        std::uniform_int_distribution<Integer> uniform(min, max);
        std::default_random_engine generator;

        std::generate_n(numbers.begin(), numbers.size(),
            [& uniform, & generator]
            {
                return uniform(generator);
            });

        return numbers;
    }